

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Poly::ArchiveIN(ChFunction_Poly *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<double[6]> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Poly>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->coeff;
  local_30._name = "coeff";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->order;
  local_48._name = "order";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Poly::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Poly>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(coeff);
    marchive >> CHNVP(order);
}